

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testString.cxx
# Opt level: O3

bool testFromStaticStringView(String *str)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  size_t __n;
  ostream *poVar4;
  bool bVar5;
  String substr;
  String local_30;
  
  if ((str->view_)._M_str != staticStringView.super_string_view._M_str) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "ASSERT_TRUE(str_const.data() == staticStringView.data()) failed on line ",0x48);
    iVar2 = 0x117;
LAB_001cb940:
    poVar4 = (ostream *)std::ostream::operator<<(&std::cout,iVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
    return false;
  }
  if ((str->view_)._M_len != staticStringView.super_string_view._M_len) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "ASSERT_TRUE(str_const.size() == staticStringView.size()) failed on line ",0x48);
    iVar2 = 0x118;
    goto LAB_001cb940;
  }
  bVar1 = cm::String::is_stable(str);
  if (bVar1) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"ASSERT_TRUE(!str_const.is_stable()) failed on line ",0x33);
    iVar2 = 0x119;
    goto LAB_001cb940;
  }
  pcVar3 = cm::String::c_str(str);
  __n = strlen(pcVar3);
  if ((__n != staticStringView.super_string_view._M_len) ||
     ((__n != 0 && (iVar2 = bcmp(pcVar3,staticStringView.super_string_view._M_str,__n), iVar2 != 0))
     )) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"ASSERT_TRUE(str.c_str() == staticStringView) failed on line ",
               0x3c);
    iVar2 = 0x11a;
    goto LAB_001cb940;
  }
  bVar1 = cm::String::is_stable(str);
  if (bVar1) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"ASSERT_TRUE(!str.is_stable()) failed on line ",0x2d);
    iVar2 = 0x11b;
    goto LAB_001cb940;
  }
  cm::String::substr(&local_30,str,1,0xffffffffffffffff);
  if (local_30.view_._M_str == staticStringView.super_string_view._M_str + 1) {
    if (local_30.view_._M_len == 2) {
      bVar1 = cm::String::is_stable(&local_30);
      if (bVar1) {
        iVar2 = 0x120;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"ASSERT_TRUE(!substr_const.is_stable()) failed on line ",
                   0x36);
      }
      else {
        pcVar3 = cm::String::c_str(&local_30);
        if (pcVar3 == staticStringView.super_string_view._M_str + 1) {
          bVar1 = cm::String::is_stable(&local_30);
          bVar5 = true;
          if (!bVar1) goto LAB_001cbac4;
          iVar2 = 0x122;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"ASSERT_TRUE(!substr.is_stable()) failed on line ",0x30);
        }
        else {
          iVar2 = 0x121;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,
                     "ASSERT_TRUE(substr.c_str() == &staticStringView[1]) failed on line ",0x43);
        }
      }
    }
    else {
      iVar2 = 0x11f;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"ASSERT_TRUE(substr_const.size() == 2) failed on line ",0x35)
      ;
    }
  }
  else {
    iVar2 = 0x11e;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "ASSERT_TRUE(substr_const.data() == &staticStringView[1]) failed on line ",0x48);
  }
  poVar4 = (ostream *)std::ostream::operator<<(&std::cout,iVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
  bVar5 = false;
LAB_001cbac4:
  if (local_30.string_.
      super___shared_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    return bVar5;
  }
  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
            (local_30.string_.
             super___shared_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi);
  return bVar5;
}

Assistant:

static bool testConstructFromN()
{
  std::cout << "testConstructFromN()\n";
  cm::String const str(3, 'a');
  ASSERT_TRUE(str.size() == 3);
  ASSERT_TRUE(std::strncmp(str.data(), "aaa", 3) == 0);
  ASSERT_TRUE(str.is_stable());
  return true;
}